

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Permutation_iterator.h
# Opt level: O3

void __thiscall
Gudhi::coxeter_triangulation::Permutation_iterator::elementary_increment_optim_3
          (Permutation_iterator *this)

{
  pointer puVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  uint uVar5;
  ulong uVar6;
  
  if (this->ct_ != 0) {
    uVar3 = this->ct_ - 1;
    this->ct_ = uVar3;
    uVar6 = (ulong)(uVar3 & 1);
    puVar1 = (this->value_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = puVar1[uVar6 + 1];
    puVar1[uVar6 + 1] = *puVar1;
    *puVar1 = uVar3;
    return;
  }
  this->ct_ = 5;
  puVar1 = (this->d_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = puVar1 + 2;
  uVar3 = puVar1[2];
  if (uVar3 == 3) {
    uVar3 = 3;
    do {
      uVar5 = uVar3;
      *puVar4 = 0;
      puVar4 = puVar1 + uVar5;
      uVar3 = *puVar4;
    } while (uVar3 == uVar5 + 1);
    uVar6 = (ulong)(uVar5 + 1);
  }
  else {
    uVar6 = 3;
    uVar5 = 2;
  }
  if (uVar5 == this->n_ - 1) {
    this->is_end_ = true;
    return;
  }
  uVar2 = 0;
  if ((uVar5 & 1) == 0) {
    uVar2 = uVar3;
  }
  puVar1 = (this->value_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = puVar1[uVar6];
  puVar1[uVar6] = puVar1[uVar2];
  puVar1[uVar2] = uVar3;
  *puVar4 = *puVar4 + 1;
  return;
}

Assistant:

void elementary_increment_optim_3() {
    if (ct_ != 0) {
      --ct_;
      swap_two_indices(1 + (ct_ % 2), 0);
    } else {
      ct_ = 5;
      uint j = 2;
      while (d_[j] == j + 1) {
        d_[j] = 0;
        ++j;
      }
      if (j == n_ - 1) {
        is_end_ = true;
        return;
      }
      uint k = j + 1;
      uint x = (k % 2 ? d_[j] : 0);
      swap_two_indices(k, x);
      ++d_[j];
    }
  }